

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

void __thiscall cursespp::App::Layout(App *this)

{
  element_type *peVar1;
  IMessageQueue *pIVar2;
  
  CheckShowOverlay(this);
  EnsureFocusIsValid(this);
  pIVar2 = Window::MessageQueue();
  (**(code **)(*(long *)pIVar2 + 0x60))(pIVar2);
  if ((this->state).overlayWindow != (IWindow *)0x0) {
    peVar1 = (this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*(peVar1->super_IOrderable)._vptr_IOrderable[2])(&peVar1->super_IOrderable);
  }
  Window::WriteToScreen((this->state).input);
  return;
}

Assistant:

void App::Layout() {
    this->CheckShowOverlay();
    this->EnsureFocusIsValid();

    /* we want to dispatch messages here, before we call WriteToScreen(),
    because dispatched messages may trigger UI updates, including layouts,
    which may lead panels to get destroyed and recreated, which can
    cause the screen to redraw outside of do_update() calls. so we dispatch
    messages, ensure our overlay is on top, then do a redraw. */
    Window::MessageQueue().Dispatch();

    if (this->state.overlayWindow) {
        this->state.overlay->BringToTop(); /* active overlay is always on top... */
    }

    /* always last to avoid flicker. see above. */
    Window::WriteToScreen(this->state.input);
}